

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void __thiscall Process::processCallback(Process *this,int fd,int mode)

{
  if (mode != 8) {
    if (this->mStdIn[1] == fd) {
      handleInput(this,fd);
      return;
    }
    if (this->mStdOut[0] == fd) {
      handleOutput(this,fd,&this->mStdOutBuffer,&this->mStdOutIndex,&this->mReadyReadStdOut);
      return;
    }
    if (this->mStdErr[0] == fd) {
      handleOutput(this,fd,&this->mStdErrBuffer,&this->mStdErrIndex,&this->mReadyReadStdErr);
      return;
    }
  }
  return;
}

Assistant:

void Process::processCallback(int fd, int mode)
{
    if (mode == EventLoop::SocketError) {
        // we're closed, shut down
        return;
    }
    if (fd == mStdIn[1])
        handleInput(fd);
    else if (fd == mStdOut[0])
        handleOutput(fd, mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
    else if (fd == mStdErr[0])
        handleOutput(fd, mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);
}